

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

bool read_seed_file(char *pSeed_filename,lzham_uint32 *num_seed_bytes,void **pSeed_bytes,
                   uint dict_size_log2)

{
  FILE *__stream;
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  
  *num_seed_bytes = 0;
  *pSeed_bytes = (void *)0x0;
  __stream = fopen64(pSeed_filename,"rb");
  if (__stream == (FILE *)0x0) {
    bVar4 = false;
    print_error("Unable to open file: %s\n",pSeed_filename);
  }
  else {
    fseeko64(__stream,0,2);
    uVar1 = ftello64(__stream);
    fseeko64(__stream,0,0);
    uVar5 = 1L << ((byte)dict_size_log2 & 0x3f);
    if (uVar1 < uVar5) {
      uVar5 = uVar1;
    }
    if ((lzham_uint32)uVar5 != 0) {
      uVar1 = uVar5 & 0xffffffff;
      pvVar2 = (void *)memalign(0x10,uVar1);
      *pSeed_bytes = pvVar2;
      if (pvVar2 != (void *)0x0) {
        *num_seed_bytes = (lzham_uint32)uVar5;
        sVar3 = fread(*pSeed_bytes,1,uVar1,__stream);
        if (sVar3 != uVar1) {
          read_seed_file();
          return false;
        }
      }
    }
    fclose(__stream);
    printf("Read File \"%s\", Size: %u bytes\n",pSeed_filename,uVar5 & 0xffffffff);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

static bool read_seed_file(const char *pSeed_filename, lzham_uint32 &num_seed_bytes, const void *&pSeed_bytes, uint dict_size_log2)
{
   num_seed_bytes = 0;
   pSeed_bytes = NULL;

   if (pSeed_filename)
   {
      FILE *pSeed_file = fopen(pSeed_filename, "rb");
      if (!pSeed_file)
      {
         print_error("Unable to open file: %s\n", pSeed_filename);
         return false;
      }

      _fseeki64(pSeed_file, 0, SEEK_END);
      uint64 seed_file_size = _ftelli64(pSeed_file);
      _fseeki64(pSeed_file, 0, SEEK_SET);

      lzham_uint32 seed_size = (lzham_uint32)my_min(seed_file_size, 1ULL << dict_size_log2);
      if (seed_size)
      {
         pSeed_bytes = _aligned_malloc(seed_size, 16);
         if (pSeed_bytes)
         {
            num_seed_bytes = (lzham_uint32)seed_size;

            if (fread((void*)pSeed_bytes, 1, seed_size, pSeed_file) != seed_size)
            {
               print_error("Failed reading file!\n");

               num_seed_bytes = 0;

               _aligned_free((void*)pSeed_bytes);
               pSeed_bytes = NULL;
               fclose(pSeed_file);
               return false;
            }
         }
      }

      fclose(pSeed_file);

      printf("Read File \"%s\", Size: %u bytes\n", pSeed_filename, seed_size);
   }

   return true;
}